

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_RemoveStringFromTemplateCache::Test_Template_RemoveStringFromTemplateCache
          (Test_Template_RemoveStringFromTemplateCache *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, RemoveStringFromTemplateCache) {
  Template::ClearCache();   // just for exercise.
  const string cache_key = "TestRemoveStringFromTemplateCache";
  const string text = "<html>here today...</html>";

  TemplateDictionary dict("test");
  ASSERT(Template::StringToTemplateCache(cache_key, text));
  Template* tpl = Template::GetTemplate(cache_key, DO_NOT_STRIP);
  ASSERT(tpl);
  AssertExpandIs(tpl, &dict, text, true);
  tpl = Template::GetTemplate(cache_key, STRIP_WHITESPACE);
  ASSERT(tpl);
  AssertExpandIs(tpl, &dict, text, true);

  Template::RemoveStringFromTemplateCache(cache_key);
  tpl = Template::GetTemplate(cache_key, DO_NOT_STRIP);
  ASSERT(!tpl);
  tpl = Template::GetTemplate(cache_key, STRIP_WHITESPACE);
  ASSERT(!tpl);
  tpl = Template::GetTemplate(cache_key, STRIP_BLANK_LINES);
  ASSERT(!tpl);
}